

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_String(char *s)

{
  bool bVar1;
  uint8_t uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    sVar3 = strlen(s);
    bVar1 = reserveSpace((uint32_t)sVar3);
    if ((bVar1) && (uVar2 = *s, uVar2 != '\0')) {
      puVar4 = (uint8_t *)(s + 1);
      do {
        currentSection->data[loadOffset + curOffset] = uVar2;
        growSection(1);
        uVar2 = *puVar4;
        puVar4 = puVar4 + 1;
      } while (uVar2 != '\0');
    }
  }
  return;
}

Assistant:

void sect_String(char const *s)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(strlen(s)))
		return;

	while (*s)
		writebyte(*s++);
}